

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O1

void __thiscall xLearn::DMatrix::AddRow(DMatrix *this)

{
  pointer *pppvVar1;
  iterator iVar2;
  iterator __position;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *local_10;
  
  local_10 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
             ((ulong)local_10 & 0xffffffff00000000);
  iVar2._M_current =
       (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&this->Y,iVar2,(float *)&local_10);
  }
  else {
    *iVar2._M_current = 0.0;
    (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_10 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
             CONCAT44(local_10._4_4_,0x3f800000);
  iVar2._M_current =
       (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&this->norm,iVar2,(float *)&local_10);
  }
  else {
    *iVar2._M_current = 1.0;
    (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_10 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0;
  __position._M_current =
       (this->row).
       super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->row).
      super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*,std::allocator<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>>
    ::_M_realloc_insert<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>
              ((vector<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*,std::allocator<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>>
                *)&this->row,__position,&local_10);
  }
  else {
    *__position._M_current = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0;
    pppvVar1 = &(this->row).
                super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  this->row_length = this->row_length + 1;
  return;
}

Assistant:

void AddRow() {
    this->Y.push_back(0);
    this->norm.push_back(1.0);
    this->row.push_back(nullptr);
    row_length++;
  }